

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemHandleBom(Mem *pMem)

{
  u8 local_15;
  int local_14;
  u8 b2;
  u8 b1;
  u8 bom;
  int rc;
  Mem *pMem_local;
  
  local_14 = 0;
  local_15 = '\0';
  if (1 < pMem->n) {
    if ((*pMem->z == -2) && (pMem->z[1] == -1)) {
      local_15 = '\x03';
    }
    if ((*pMem->z == -1) && (pMem->z[1] == -2)) {
      local_15 = '\x02';
    }
  }
  if ((local_15 != '\0') && (local_14 = sqlite3VdbeMemMakeWriteable(pMem), local_14 == 0)) {
    pMem->n = pMem->n + -2;
    memmove(pMem->z,pMem->z + 2,(long)pMem->n);
    pMem->z[pMem->n] = '\0';
    pMem->z[pMem->n + 1] = '\0';
    pMem->flags = pMem->flags | 0x200;
    pMem->enc = local_15;
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemHandleBom(Mem *pMem){
  int rc = SQLITE_OK;
  u8 bom = 0;

  assert( pMem->n>=0 );
  if( pMem->n>1 ){
    u8 b1 = *(u8 *)pMem->z;
    u8 b2 = *(((u8 *)pMem->z) + 1);
    if( b1==0xFE && b2==0xFF ){
      bom = SQLITE_UTF16BE;
    }
    if( b1==0xFF && b2==0xFE ){
      bom = SQLITE_UTF16LE;
    }
  }

  if( bom ){
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc==SQLITE_OK ){
      pMem->n -= 2;
      memmove(pMem->z, &pMem->z[2], pMem->n);
      pMem->z[pMem->n] = '\0';
      pMem->z[pMem->n+1] = '\0';
      pMem->flags |= MEM_Term;
      pMem->enc = bom;
    }
  }
  return rc;
}